

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void cmELFByteSwap(undefined1 *data)

{
  undefined1 uVar1;
  char one_byte;
  char *data_local;
  
  uVar1 = *data;
  *data = data[3];
  data[3] = uVar1;
  uVar1 = data[1];
  data[1] = data[2];
  data[2] = uVar1;
  return;
}

Assistant:

void cmELFByteSwap(char* data, cmELFByteSwapSize<4> /*unused*/)
{
  char one_byte;
  one_byte = data[0];
  data[0] = data[3];
  data[3] = one_byte;
  one_byte = data[1];
  data[1] = data[2];
  data[2] = one_byte;
}